

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Scalar::Scalar(Scalar *this,double d,string *name,string *type)

{
  allocator<char> local_59;
  string local_58;
  string *local_28;
  string *type_local;
  string *name_local;
  double d_local;
  Scalar *this_local;
  
  local_28 = type;
  type_local = name;
  name_local = (string *)d;
  d_local = (double)this;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__Scalar_00190518;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Scalar_001905c8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Scalar_00190610;
  this->scalarValue = (double)name_local;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
              physicalDescription,(string *)type_local);
  std::__cxx11::string::operator=
            ((string *)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription,
             "scalar");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"value",&local_59);
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

Scalar::Scalar(double d, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	scalarValue = d;
	physicalDescription = name;
	stochDescription = "scalar";
	addParameter("value");
}